

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  Btree **ppBtree;
  int *piVar1;
  sqlite3 *db;
  Db *pDVar2;
  Pager *pPVar3;
  Btree *pBVar4;
  char *pcVar5;
  Btree *pBVar6;
  Schema *pSVar7;
  u8 uVar8;
  undefined6 uVar9;
  u8 uVar10;
  u8 uVar11;
  undefined6 uVar12;
  int iVar13;
  int iVar14;
  char *pcVar15;
  char *zRight;
  Db *pDVar16;
  Schema *pSVar17;
  long lVar18;
  long lVar19;
  char *zErrDyn;
  uint flags;
  char *zPath;
  char *zErr;
  sqlite3_vfs *pVfs;
  char *local_68;
  uint local_5c;
  sqlite3_context *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  sqlite3_vfs *local_38;
  
  db = context->pOut->db;
  iVar13 = 0;
  local_50 = (char *)0x0;
  local_40 = (char *)0x0;
  local_68 = (char *)0x0;
  pcVar15 = (char *)sqlite3ValueText(*argv,'\x01');
  zRight = (char *)sqlite3ValueText(argv[1],'\x01');
  if (pcVar15 == (char *)0x0) {
    pcVar15 = "";
  }
  if (zRight == (char *)0x0) {
    zRight = "";
  }
  if (db->nDb < db->aLimit[7] + 2) {
    lVar18 = (long)db->nDb;
    local_58 = context;
    local_48 = pcVar15;
    if (0 < lVar18) {
      pDVar16 = db->aDb;
      lVar19 = 0;
      do {
        iVar13 = sqlite3StrICmp(*(char **)((long)&pDVar16->zDbSName + lVar19),zRight);
        if (iVar13 == 0) {
          iVar13 = 0;
          local_68 = sqlite3MPrintf(db,"database %s is already in use",zRight);
          context = local_58;
          goto LAB_001a74de;
        }
        lVar19 = lVar19 + 0x20;
      } while (lVar18 << 5 != lVar19);
    }
    if (db->aDb == db->aDbStatic) {
      pDVar16 = (Db *)sqlite3DbMallocRawNN(db,0x60);
      if (pDVar16 == (Db *)0x0) {
        return;
      }
      pDVar2 = db->aDb;
      pcVar15 = pDVar2->zDbSName;
      pBVar4 = pDVar2->pBt;
      uVar10 = pDVar2->safety_level;
      uVar11 = pDVar2->bSyncSet;
      uVar12 = *(undefined6 *)&pDVar2->field_0x12;
      pSVar17 = pDVar2->pSchema;
      pcVar5 = pDVar2[1].zDbSName;
      pBVar6 = pDVar2[1].pBt;
      uVar8 = pDVar2[1].bSyncSet;
      uVar9 = *(undefined6 *)&pDVar2[1].field_0x12;
      pSVar7 = pDVar2[1].pSchema;
      pDVar16[1].safety_level = pDVar2[1].safety_level;
      pDVar16[1].bSyncSet = uVar8;
      *(undefined6 *)&pDVar16[1].field_0x12 = uVar9;
      pDVar16[1].pSchema = pSVar7;
      pDVar16[1].zDbSName = pcVar5;
      pDVar16[1].pBt = pBVar6;
      pDVar16->safety_level = uVar10;
      pDVar16->bSyncSet = uVar11;
      *(undefined6 *)&pDVar16->field_0x12 = uVar12;
      pDVar16->pSchema = pSVar17;
      pDVar16->zDbSName = pcVar15;
      pDVar16->pBt = pBVar4;
    }
    else {
      pDVar16 = (Db *)sqlite3DbRealloc(db,db->aDb,lVar18 * 0x20 + 0x20);
      if (pDVar16 == (Db *)0x0) {
        return;
      }
    }
    context = local_58;
    db->aDb = pDVar16;
    iVar13 = db->nDb;
    pDVar2 = pDVar16 + iVar13;
    pDVar2->safety_level = '\0';
    pDVar2->bSyncSet = '\0';
    *(undefined6 *)&pDVar2->field_0x12 = 0;
    *(Schema **)(&pDVar2->safety_level + 8) = (Schema *)0x0;
    pDVar16[iVar13].zDbSName = (char *)0x0;
    pDVar16[iVar13].pBt = (Btree *)0x0;
    local_5c = db->openFlags;
    iVar14 = sqlite3ParseUri(db->pVfs->zName,local_48,&local_5c,&local_38,&local_50,&local_40);
    if (iVar14 != 0) {
      if (iVar14 == 7) {
        sqlite3OomFault(db);
      }
      pcVar15 = local_40;
      context->isError = 1;
      sqlite3VdbeMemSetStr
                (context->pOut,local_40,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3_free(pcVar15);
      return;
    }
    pDVar16 = pDVar16 + iVar13;
    local_5c = local_5c | 0x100;
    ppBtree = &pDVar16->pBt;
    iVar13 = sqlite3BtreeOpen(local_38,local_50,db,ppBtree,0,local_5c);
    db->nDb = db->nDb + 1;
    pcVar15 = sqlite3DbStrDup(db,zRight);
    pDVar16->zDbSName = pcVar15;
    db->noSharedCache = '\0';
    if (iVar13 == 0) {
      pSVar17 = sqlite3SchemaGet(db,pDVar16->pBt);
      pDVar16->pSchema = pSVar17;
      if (pSVar17 == (Schema *)0x0) {
        iVar13 = 7;
      }
      else {
        iVar13 = 0;
        if ((pSVar17->file_format != '\0') && (pSVar17->enc != db->enc)) {
          local_68 = sqlite3MPrintf(db,
                                    "attached databases must use the same text encoding as main database"
                                   );
          iVar13 = 1;
        }
      }
      sqlite3BtreeEnter(*ppBtree);
      pBVar4 = *ppBtree;
      pPVar3 = pBVar4->pBt->pPager;
      if (pPVar3->tempFile == '\0') {
        if ((pPVar3->pWal == (Wal *)0x0) || (pPVar3->pWal->exclusiveMode != '\x02')) {
          pPVar3->exclusiveMode = db->dfltLockMode;
        }
      }
      iVar14 = sqlite3BtreeSecureDelete(db->aDb->pBt,-1);
      sqlite3BtreeSecureDelete(pBVar4,iVar14);
      sqlite3BtreeSetPagerFlags(*ppBtree,(uint)db->flags & 0x38 | 3);
      pBVar4 = *ppBtree;
      if (pBVar4->sharable != '\0') {
        piVar1 = &pBVar4->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(pBVar4);
        }
      }
    }
    else if (iVar13 == 0x13) {
      local_68 = sqlite3MPrintf(db,"database is already attached");
      iVar13 = 1;
    }
    pDVar16->safety_level = '\x03';
    if ((iVar13 == 0) && (iVar13 = 7, pDVar16->zDbSName != (char *)0x0)) {
      iVar13 = 0;
    }
    sqlite3_free(local_50);
    if (iVar13 == 0) {
      if (db->noSharedCache == '\0') {
        btreeEnterAll(db);
      }
      (db->init).iDb = '\0';
      *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xef;
      iVar13 = sqlite3Init(db,&local_68);
      if (db->noSharedCache == '\0') {
        btreeLeaveAll(db);
      }
    }
    if (iVar13 == 0) {
      return;
    }
    lVar18 = (long)db->nDb + -1;
    pBVar4 = db->aDb[lVar18].pBt;
    if (pBVar4 != (Btree *)0x0) {
      sqlite3BtreeClose(pBVar4);
      pDVar16 = db->aDb;
      pDVar16[lVar18].pBt = (Btree *)0x0;
      pDVar16[lVar18].pSchema = (Schema *)0x0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = (int)lVar18;
    if ((iVar13 == 0xc0a) || (iVar13 == 7)) {
      sqlite3OomFault(db);
      if (local_68 != (char *)0x0) {
        sqlite3DbFreeNN(db,local_68);
      }
      local_68 = sqlite3MPrintf(db,"out of memory");
    }
    else if (local_68 == (char *)0x0) {
      local_68 = sqlite3MPrintf(db,"unable to open database: %s",local_48);
    }
  }
  else {
    local_68 = sqlite3MPrintf(db,"too many attached databases - max %d");
  }
LAB_001a74de:
  if (local_68 != (char *)0x0) {
    context->isError = 1;
    sqlite3VdbeMemSetStr(context->pOut,local_68,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
    ;
    if (local_68 != (char *)0x0) {
      sqlite3DbFreeNN(db,local_68);
    }
  }
  if (iVar13 != 0) {
    sqlite3_result_error_code(context,iVar13);
  }
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;                 /* New array of Db pointers */
  Db *pNew;                 /* Db object for the newly attached database */
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);
  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

#ifdef SQLITE_ENABLE_DESERIALIZE
# define REOPEN_AS_MEMDB(db)  (db->init.reopenMemdb)
#else
# define REOPEN_AS_MEMDB(db)  (0)
#endif

  if( REOPEN_AS_MEMDB(db) ){
    /* This is not a real ATTACH.  Instead, this routine is being called
    ** from sqlite3_deserialize() to close database db->init.iDb and
    ** reopen it as a MemDB */
    pVfs = sqlite3_vfs_find("memdb");
    if( pVfs==0 ) return;
    pNew = &db->aDb[db->init.iDb];
    if( pNew->pBt ) sqlite3BtreeClose(pNew->pBt);
    pNew->pBt = 0;
    pNew->pSchema = 0;
    rc = sqlite3BtreeOpen(pVfs, "x\0", db, &pNew->pBt, 0, SQLITE_OPEN_MAIN_DB);
  }else{
    /* This is a real ATTACH
    **
    ** Check for the following errors:
    **
    **     * Too many attached databases,
    **     * Transaction currently open
    **     * Specified database name already being used.
    */
    if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
      zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d", 
        db->aLimit[SQLITE_LIMIT_ATTACHED]
      );
      goto attach_error;
    }
    for(i=0; i<db->nDb; i++){
      char *z = db->aDb[i].zDbSName;
      assert( z && zName );
      if( sqlite3StrICmp(z, zName)==0 ){
        zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
        goto attach_error;
      }
    }
  
    /* Allocate the new entry in the db->aDb[] array and initialize the schema
    ** hash tables.
    */
    if( db->aDb==db->aDbStatic ){
      aNew = sqlite3DbMallocRawNN(db, sizeof(db->aDb[0])*3 );
      if( aNew==0 ) return;
      memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
    }else{
      aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
      if( aNew==0 ) return;
    }
    db->aDb = aNew;
    pNew = &db->aDb[db->nDb];
    memset(pNew, 0, sizeof(*pNew));
  
    /* Open the database file. If the btree is successfully opened, use
    ** it to obtain the database schema. At this point the schema may
    ** or may not be initialized.
    */
    flags = db->openFlags;
    rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
    assert( pVfs );
    flags |= SQLITE_OPEN_MAIN_DB;
    rc = sqlite3BtreeOpen(pVfs, zPath, db, &pNew->pBt, 0, flags);
    db->nDb++;
    pNew->zDbSName = sqlite3DbStrDup(db, zName);
  }
  db->noSharedCache = 0;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    pNew->pSchema = sqlite3SchemaGet(db, pNew->pBt);
    if( !pNew->pSchema ){
      rc = SQLITE_NOMEM_BKPT;
    }else if( pNew->pSchema->file_format && pNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db, 
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(pNew->pBt);
    pPager = sqlite3BtreePager(pNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(pNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(pNew->pBt,
                      PAGER_SYNCHRONOUS_FULL | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(pNew->pBt);
  }
  pNew->safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  if( rc==SQLITE_OK && pNew->zDbSName==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }


#ifdef SQLITE_HAS_CODEC
  if( rc==SQLITE_OK ){
    extern int sqlite3CodecAttach(sqlite3*, int, const void*, int);
    extern void sqlite3CodecGetKey(sqlite3*, int, void**, int*);
    int nKey;
    char *zKey;
    int t = sqlite3_value_type(argv[2]);
    switch( t ){
      case SQLITE_INTEGER:
      case SQLITE_FLOAT:
        zErrDyn = sqlite3DbStrDup(db, "Invalid key value");
        rc = SQLITE_ERROR;
        break;
        
      case SQLITE_TEXT:
      case SQLITE_BLOB:
        nKey = sqlite3_value_bytes(argv[2]);
        zKey = (char *)sqlite3_value_blob(argv[2]);
        rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        break;

      case SQLITE_NULL:
        /* No key specified.  Use the key from URI filename, or if none,
        ** use the key from the main database. */
        if( sqlite3CodecQueryParameters(db, zName, zPath)==0 ){
          sqlite3CodecGetKey(db, 0, (void**)&zKey, &nKey);
          if( nKey || sqlite3BtreeGetOptimalReserve(db->aDb[0].pBt)>0 ){
            rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
          }
        }
        break;
    }
  }
#endif
  sqlite3_free( zPath );

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and 
  ** remove the entry from the db->aDb[] array. i.e. put everything back the
  ** way we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    db->init.iDb = 0;
    db->mDbFlags &= ~(DBFLAG_SchemaKnownOk);
    if( !REOPEN_AS_MEMDB(db) ){
      rc = sqlite3Init(db, &zErrDyn);
    }
    sqlite3BtreeLeaveAll(db);
    assert( zErrDyn==0 || rc!=SQLITE_OK );
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK && !REOPEN_AS_MEMDB(db) ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    if( !REOPEN_AS_MEMDB(db) ){
      int iDb = db->nDb - 1;
      assert( iDb>=2 );
      if( db->aDb[iDb].pBt ){
        sqlite3BtreeClose(db->aDb[iDb].pBt);
        db->aDb[iDb].pBt = 0;
        db->aDb[iDb].pSchema = 0;
      }
      sqlite3ResetAllSchemasOfConnection(db);
      db->nDb = iDb;
      if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
        sqlite3OomFault(db);
        sqlite3DbFree(db, zErrDyn);
        zErrDyn = sqlite3MPrintf(db, "out of memory");
      }else if( zErrDyn==0 ){
        zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
      }
    }
    goto attach_error;
  }
  
  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}